

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::Clipper(Clipper *this,int initOptions)

{
  byte bVar1;
  
  *(undefined8 *)&this->field_0xb8 = 0;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(undefined8 *)&this->field_0xc8 = 0;
  *(undefined8 *)&this->field_0xd8 = 0;
  *(undefined8 *)&this->field_0xe0 = 0;
  *(undefined8 *)&this->field_0xe8 = 0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined8 *)&this->field_0x100 = 0;
  *(undefined8 *)&this->field_0x108 = 0;
  *(undefined8 *)&this->field_0x90 = 0;
  *(undefined8 *)&this->field_0x98 = 0;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(undefined8 *)&this->field_0xa8 = 0;
  this->_vptr_Clipper = (_func_int **)&PTR_ExecuteInternal_00123c60;
  *(undefined ***)&this->field_0x88 = &PTR__Clipper_00123ca8;
  (this->m_Joins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Joins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Joins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_GhostJoins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_GhostJoins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_GhostJoins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_IntersectList).
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_IntersectList).
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_IntersectList).
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_Maxima;
  (this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_Maxima;
  (this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size =
       0;
  this->m_ExecuteLocked = false;
  this->field_0xb0 = 0;
  bVar1 = (byte)initOptions;
  this->m_ReverseOutput = (bool)(bVar1 & 1);
  this->m_StrictSimple = (bool)(bVar1 >> 1 & 1);
  this->field_0xd0 = bVar1 >> 2 & 1;
  this->field_0xd1 = 0;
  return;
}

Assistant:

Clipper::Clipper(int initOptions) : ClipperBase() //constructor
{
  m_ExecuteLocked = false;
  m_UseFullRange = false;
  m_ReverseOutput = ((initOptions & ioReverseSolution) != 0);
  m_StrictSimple = ((initOptions & ioStrictlySimple) != 0);
  m_PreserveCollinear = ((initOptions & ioPreserveCollinear) != 0);
  m_HasOpenPaths = false;
#ifdef use_xyz  
  m_ZFill = 0;
#endif
}